

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Amr.cpp
# Opt level: O3

Real amrex::Amr::computeOptimalSubcycling
               (int n,int *best,Real *dt_max,Real *est_work,int *cycle_max)

{
  Real RVar1;
  Real RVar2;
  int i;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  Real RVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  Real RVar13;
  vector<int,_std::allocator<int>_> cycles;
  allocator_type local_51;
  Real local_50;
  vector<int,_std::allocator<int>_> local_48;
  
  uVar5 = (ulong)(uint)n;
  std::vector<int,_std::allocator<int>_>::vector(&local_48,(long)n,&local_51);
  iVar6 = 1;
  if (1 < n) {
    uVar4 = 1;
    do {
      iVar6 = iVar6 * cycle_max[uVar4];
      uVar4 = uVar4 + 1;
    } while (uVar5 != uVar4);
    if (iVar6 < 1) {
      local_50 = 0.0;
      goto LAB_005b3a36;
    }
  }
  RVar1 = *dt_max;
  RVar2 = *est_work;
  local_50 = 0.0;
  iVar7 = 0;
  dVar11 = 1e+200;
  do {
    *local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = 1;
    RVar9 = RVar2;
    dVar12 = RVar1;
    if (1 < n) {
      iVar8 = *local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar4 = 1;
      RVar13 = RVar1;
      iVar3 = iVar7;
      do {
        iVar8 = iVar8 * (iVar3 % cycle_max[uVar4] + 1);
        local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[uVar4] = iVar8;
        iVar3 = iVar3 / cycle_max[uVar4];
        dVar12 = dt_max[uVar4] * (double)iVar8;
        if (RVar13 <= dVar12) {
          dVar12 = RVar13;
        }
        RVar9 = RVar9 + (double)iVar8 * est_work[uVar4];
        uVar4 = uVar4 + 1;
        RVar13 = dVar12;
      } while (uVar5 != uVar4);
    }
    dVar10 = RVar9 / dVar12;
    if (dVar10 < dVar11) {
      local_50 = dVar12;
    }
    if (dVar10 < dVar11 && 0 < n) {
      uVar4 = 0;
      do {
        best[uVar4] = local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start[uVar4];
        uVar4 = uVar4 + 1;
        local_50 = dVar12;
      } while (uVar5 != uVar4);
    }
    else if (dVar11 <= dVar10) {
      dVar10 = dVar11;
    }
    iVar7 = iVar7 + 1;
    dVar11 = dVar10;
  } while (iVar7 != iVar6);
LAB_005b3a36:
  if (1 < n) {
    uVar5 = uVar5 + 1;
    do {
      best[uVar5 - 2] = best[uVar5 - 2] / best[uVar5 - 3];
      uVar5 = uVar5 - 1;
    } while (2 < uVar5);
  }
  if (local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return local_50;
}

Assistant:

Real
Amr::computeOptimalSubcycling(int n, int* best, Real* dt_max, Real* est_work, int* cycle_max)
{
    BL_ASSERT(cycle_max[0] == 1);
    // internally these represent the total number of steps at a level,
    // not the number of cycles
    std::vector<int> cycles(n);
#ifdef AMREX_USE_FLOAT
    Real best_ratio = 1e30f;
#else
    Real best_ratio = 1e200;
#endif
    Real best_dt = 0;
    Real ratio;
    Real dt;
    Real work;
    int limit = 1;
    // This provides a memory efficient way to test all candidates
    for (int i = 1; i < n; i++)
        limit *= cycle_max[i];
    for (int candidate = 0; candidate < limit; candidate++)
    {
        int temp_cand = candidate;
        cycles[0] = 1;
        dt = dt_max[0];
        work = est_work[0];
        for (int i  = 1; i < n; i++)
        {
            // grab the relevant "digit" and shift over.
            cycles[i] = (1 + temp_cand%cycle_max[i]) * cycles[i-1];
            temp_cand /= cycle_max[i];
            dt = std::min(dt, cycles[i]*dt_max[i]);
            work += cycles[i]*est_work[i];
        }
        ratio = work/dt;
        if (ratio < best_ratio)
        {
            for (int i  = 0; i < n; i++)
                best[i] = cycles[i];
            best_ratio = ratio;
            best_dt = dt;
        }
    }
    //
    // Now we convert best back to n_cycles format
    //
    for (int i = n-1; i > 0; i--)
        best[i] /= best[i-1];
    return best_dt;
}